

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_class.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseClass
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  Token *tokId_00;
  undefined8 uVar1;
  bool bVar2;
  Token **in_RDX;
  bool *err_00;
  bool err;
  undefined1 local_b8 [16];
  Token *tokId;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  constructAttributes;
  TemplateDecls templ;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  attrs;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  functions;
  undefined1 local_40 [16];
  
  sanityExpect((Parser *)caps,TOK_KW_CLASS);
  bVar2 = Token::operator==(*(Token **)
                             ((long)&(caps->_M_t).
                                     super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                     .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                     _M_head_impl[3].required.
                                     super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                             + 8),TOK_KW_TRAIT);
  if (bVar2) {
    parseClassTrait(this,caps);
  }
  else {
    err = false;
    templ.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    templ.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    templ.
    super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8._8_8_ = in_RDX;
    bVar2 = Token::operator==(*(Token **)
                               ((long)&(caps->_M_t).
                                       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                       .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                       _M_head_impl[3].required.
                                       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                               + 8),TOK_OP_TEMPL_BRACKET_OPEN);
    if (bVar2) {
      parseTemplateDecl((TemplateDecls *)&constructAttributes,(Parser *)caps);
      std::
      vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ::_M_move_assign(&templ,&constructAttributes);
      std::
      vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ::~vector((vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                 *)&constructAttributes);
      err = true;
    }
    tokId_00 = *(Token **)
                ((long)&(caps->_M_t).
                        super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                        .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].
                        required.
                        super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                + 8);
    tokId = tokId_00;
    bVar2 = expect((Parser *)caps,TOK_ID);
    if (!bVar2) {
      functions.
      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)
           CONCAT62(functions.
                    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next._2_6_,2);
      attrs.
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)
           CONCAT44(attrs.
                    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next._4_4_,8);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&constructAttributes,(SyntaxErrorCode *)&functions,(Position *)&attrs);
      generateError((Parser *)(local_40 + 8),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)caps);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_40 + 8));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)&constructAttributes);
      err = true;
    }
    constructAttributes.
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node._M_size = 0;
    err_00 = (bool *)0x2f;
    constructAttributes.
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&constructAttributes;
    constructAttributes.
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&constructAttributes;
    bVar2 = Token::operator==(*(Token **)
                               ((long)&(caps->_M_t).
                                       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                                       .super__Head_base<0UL,_pfederc::Capabilities_*,_false>.
                                       _M_head_impl[3].required.
                                       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                               + 8),TOK_OP_BRACKET_OPEN);
    if (bVar2) {
      parseClassConstructor((Parser *)caps,err_00,&constructAttributes);
    }
    bVar2 = expect((Parser *)caps,TOK_EOL);
    if (!bVar2) {
      local_b8._0_2_ = 2;
      functions.
      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)
           CONCAT44(functions.
                    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next._4_4_,0xf);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)&attrs,(SyntaxErrorCode *)local_b8,(Position *)&functions);
      generateError((Parser *)local_40,
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)caps);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 local_40);
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)&attrs);
    }
    attrs.
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node._M_size = 0;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&functions;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node._M_size = 0;
    attrs.
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&attrs;
    attrs.
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&attrs;
    functions.
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         functions.
         super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    parseClassBody((Parser *)caps,tokId_00,&err,&attrs,
                   (list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                    *)functions.
                      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next);
    std::
    make_unique<pfederc::ClassExpr,pfederc::Lexer&,pfederc::Position_const&,std::unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>>,pfederc::Token_const*const&,std::vector<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>,std::allocator<std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>>>,std::__cxx11::list<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>,std::allocator<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>>>,std::__cxx11::list<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>,std::allocator<std::unique_ptr<pfederc::BiOpExpr,std::default_delete<pfederc::BiOpExpr>>>>,std::__cxx11::list<std::unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>>,std::allocator<std::unique_ptr<pfederc::FuncExpr,std::default_delete<pfederc::FuncExpr>>>>>
              ((Lexer *)local_b8,
               (Position *)
               (caps->_M_t).
               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
               ._M_t.
               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl,
               (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
               &tokId_00->pos,(Token **)local_b8._8_8_,
               (vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                *)&tokId,
               (list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                *)&templ,&constructAttributes,
               (list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                *)&attrs);
    uVar1 = local_b8._0_8_;
    local_b8._0_8_ =
         (__uniq_ptr_impl<pfederc::ClassExpr,_std::default_delete<pfederc::ClassExpr>_>)0x0;
    this->lexer = (Lexer *)uVar1;
    std::unique_ptr<pfederc::ClassExpr,_std::default_delete<pfederc::ClassExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ClassExpr,_std::default_delete<pfederc::ClassExpr>_> *)local_b8)
    ;
    std::__cxx11::
    _List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ::_M_clear(&functions.
                super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
              );
    std::__cxx11::
    _List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ::_M_clear(&attrs.
                super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
              );
    std::__cxx11::
    _List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ::_M_clear(&constructAttributes.
                super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
              );
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::~vector(&templ);
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseClass(std::unique_ptr<Capabilities> &&caps) noexcept {
  sanityExpect(TokenType::TOK_KW_CLASS);
  // maybe it's a class trait
  if (*lexer.getCurrentToken() == TokenType::TOK_KW_TRAIT)
    return parseClassTrait(std::move(caps));

  bool err = false;

  // class templ?
  TemplateDecls templ;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_TEMPL_BRACKET_OPEN) {
    templ = parseTemplateDecl();
    err = true;
  }

  // class templ? id
  const Token *const tokId = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_ID, tokId->getPosition()));
    err = true;
  }

  std::list<std::unique_ptr<BiOpExpr>> constructAttributes;
  // class templ? id constructor?
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_BRACKET_OPEN) {
    parseClassConstructor(err, constructAttributes);
  }
  // class templ? id constructor? newline
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
  }

  std::list<std::unique_ptr<BiOpExpr>> attrs;
  std::list<std::unique_ptr<FuncExpr>> functions;
	parseClassBody(tokId, err, attrs, functions);

  return std::make_unique<ClassExpr>(lexer, tokId->getPosition(), std::move(caps),
    tokId, std::move(templ), std::move(constructAttributes),
    std::move(attrs), std::move(functions));
}